

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_test_listener.cc
# Opt level: O0

void ResponseHandleParserEvent(HttpTestListener *req,int type,char *buf,int len)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  long lVar4;
  mapped_type *pmVar5;
  char *pcVar6;
  key_type local_120;
  string local_100 [36];
  undefined4 local_dc;
  string local_d8 [4];
  int pos;
  string str_pair;
  int i;
  undefined1 local_90 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec_query_pair;
  string local_68 [8];
  string query;
  http_parser_url url;
  int len_local;
  char *buf_local;
  int type_local;
  HttpTestListener *req_local;
  
  switch(type) {
  case 2:
    std::__cxx11::string::assign((char *)&req->request_url_,(ulong)buf);
    http_parser_parse_url_(buf,(long)len,0,(undefined1 *)((long)&query.field_2 + 0xc));
    if ((query.field_2._12_2_ & 0x10) != 0) {
      std::__cxx11::string::string(local_68);
      std::__cxx11::string::assign((char *)local_68,(ulong)(buf + url.field_data[2].off));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&i,"&",(allocator<char> *)(str_pair.field_2._M_local_buf + 0xf));
      strsplit(local_68,local_90,&i);
      std::__cxx11::string::~string((string *)&i);
      std::allocator<char>::~allocator((allocator<char> *)(str_pair.field_2._M_local_buf + 0xf));
      for (str_pair.field_2._8_4_ = 0; uVar1 = (ulong)(int)str_pair.field_2._8_4_,
          sVar2 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_90), uVar1 < sVar2;
          str_pair.field_2._8_4_ = str_pair.field_2._8_4_ + 1) {
        pvVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_90,(long)(int)str_pair.field_2._8_4_);
        std::__cxx11::string::string(local_d8,(string *)pvVar3);
        local_dc = std::__cxx11::string::find((char *)local_d8,0x1278fe);
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)local_100,(ulong)local_d8);
        std::__cxx11::string::substr((ulong)&local_120,(ulong)local_d8);
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&req->map_request_query_,&local_120);
        std::__cxx11::string::operator=((string *)pmVar5,local_100);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string(local_100);
        std::__cxx11::string::~string(local_d8);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_90);
      std::__cxx11::string::~string(local_68);
    }
    break;
  case 3:
    if ((req->is_last_value_ & 1U) != 0) {
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&req->map_request_header_,&req->last_request_field_);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&req->last_request_value_);
      std::__cxx11::string::operator=((string *)&req->last_request_field_,"");
      std::__cxx11::string::operator=((string *)&req->last_request_value_,"");
    }
    std::__cxx11::string::append((char *)&req->last_request_field_,(ulong)buf);
    req->is_last_value_ = false;
    break;
  case 4:
    req->is_last_value_ = true;
    std::__cxx11::string::append((char *)&req->last_request_value_,(ulong)buf);
    break;
  case 5:
    lVar4 = std::__cxx11::string::size();
    if (lVar4 != 0) {
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&req->map_request_header_,&req->last_request_field_);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&req->last_request_value_);
      std::__cxx11::string::operator=((string *)&req->last_request_field_,"");
      std::__cxx11::string::operator=((string *)&req->last_request_value_,"");
    }
    pcVar6 = (char *)http_method_str_(req->parser_->method);
    std::__cxx11::string::operator=((string *)&req->request_method_,pcVar6);
    break;
  case 6:
    std::__cxx11::string::append((char *)&req->request_body_,(ulong)buf);
    break;
  case 7:
    req->is_request_complete_ = true;
  }
  return;
}

Assistant:

void ResponseHandleParserEvent(HttpTestListener* req, int type, char* buf, int len) {
  switch(type) {
  case PARSER_EVENT_URL: {
    req->request_url_.assign(buf, len);
    http_parser_url url;
    http_parser_parse_url_(buf, len, 0, &url);
    if(url.field_set & 1 << (UF_QUERY)) {
      std::string query;
      query.assign(&buf[url.field_data[UF_QUERY].off], url.field_data[UF_QUERY].len);
      std::vector<std::string> vec_query_pair;
      strsplit(query, vec_query_pair, "&");
      for(int i = 0; i < vec_query_pair.size(); i++) {
        std::string str_pair = vec_query_pair[i];
        int pos = str_pair.find("=");
        req->map_request_query_[str_pair.substr(0, pos)] = str_pair.substr(pos + 1, str_pair.size() - pos - 1);
      }
    }
    
    break;
  }
  case PARSER_EVENT_FIELD: {
    if(req->is_last_value_) {
      req->map_request_header_[req->last_request_field_] = req->last_request_value_;
      req->last_request_field_ = "";
      req->last_request_value_ = "";
    }
     req->last_request_field_.append(buf, len);
     req->is_last_value_ = false;
  }
    break;

  case PARSER_EVENT_VALUE: {
    req->is_last_value_ = true;
    req->last_request_value_.append(buf, len);
    break;
  }

  case PARSER_EVENT_HEADER_COMPLETE: {
    if(req->last_request_field_.size() > 0) {
      req->map_request_header_[req->last_request_field_] = req->last_request_value_;
      req->last_request_field_ = "";
      req->last_request_value_ = "";
    }

    req->request_method_ = http_method_str_((http_method)req->parser_->method);
    break;
  }
  case PARSER_EVENT_BODY: {
    req->request_body_.append(buf, len);
    break;
  }

  case PARSER_EVENT_MSG_COMPLETE: {
    req->is_request_complete_ = true;
    break;
  }
}

}